

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O2

rc_size __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  rc_data *prVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 in_XMM3_Qb;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  _Head_base<0UL,_int_*,_false> local_50;
  int *local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  bit_array *local_38;
  
  local_40._M_head_impl = (int *)&this->ap;
  uVar6 = 0;
  uVar4 = 0;
  local_38 = x;
  for (; begin != end; begin = begin + 1) {
    sparse_matrix<int>::column((sparse_matrix<int> *)&local_50,(int)local_40._M_head_impl);
    auVar7 = ZEXT816(0) << 0x40;
    auVar9 = ZEXT816(0) << 0x40;
    while( true ) {
      if (local_48 == local_50._M_head_impl) break;
      iVar3 = value_bit_array<-1,_1>::get(&this->A,*local_48);
      auVar10._0_8_ = (double)iVar3;
      auVar10._8_8_ = in_XMM3_Qb;
      auVar7._8_8_ = 0;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = auVar9._0_8_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (this->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                     _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl[local_48[1]];
      auVar7 = vfmadd231sd_fma(auVar7,auVar10,auVar1);
      iVar3 = *local_48;
      local_48 = local_48 + 2;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                     _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl[iVar3];
      auVar9 = vfmadd231sd_fma(auVar12,auVar10,auVar2);
    }
    (this->R)._M_t.
    super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
    .
    super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
    ._M_head_impl[uVar6].id = (int)uVar6;
    dVar8 = quadratic_cost_type<double>::operator()(this->c,begin->column,local_38);
    (this->R)._M_t.
    super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
    .
    super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
    ._M_head_impl[uVar6].value = (dVar8 - auVar7._0_8_) - auVar9._0_8_;
    iVar3 = value_bit_array<-1,_1>::get(&this->A,begin->value);
    prVar5 = (this->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
             ._M_head_impl;
    prVar5[uVar6].f = iVar3;
    if (iVar3 < 0) {
      prVar5 = prVar5 + uVar6;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = prVar5->value;
      auVar9._8_8_ = 0x8000000000000000;
      auVar9._0_8_ = 0x8000000000000000;
      auVar7 = vxorpd_avx512vl(auVar11,auVar9);
      uVar4 = uVar4 + 1;
      dVar8 = (double)vmovlpd_avx(auVar7);
      prVar5->value = dVar8;
    }
    uVar6 = uVar6 + 1;
  }
  return (rc_size)(uVar6 & 0xffffffff | (ulong)uVar4 << 0x20);
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A.get(std::get<0>(ht)->value));

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A.get(begin->value);

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }